

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

void __thiscall wabt::FileStream::FileStream(FileStream *this,FileStream *other)

{
  (this->super_Stream).offset_ = 0;
  (this->super_Stream).result_.enum_ = Ok;
  (this->super_Stream).log_stream_ = (Stream *)0x0;
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__FileStream_0019c878;
  this->file_ = other->file_;
  this->offset_ = other->offset_;
  this->should_close_ = other->should_close_;
  other->file_ = (FILE *)0x0;
  other->offset_ = 0;
  other->should_close_ = false;
  return;
}

Assistant:

FileStream::FileStream(FileStream&& other) {
  *this = std::move(other);
}